

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::values::detail::SignedCheck<int,true>::operator()
          (SignedCheck<int,true> *this,bool negative,uint u,string *text)

{
  uint uVar1;
  argument_incorrect_type *paVar2;
  string *text_local;
  uint u_local;
  bool negative_local;
  SignedCheck<int,_true> *this_local;
  
  if (negative) {
    uVar1 = std::numeric_limits<int>::min();
    if (uVar1 < u) {
      paVar2 = (argument_incorrect_type *)__cxa_allocate_exception(0x28);
      argument_incorrect_type::argument_incorrect_type(paVar2,text);
      __cxa_throw(paVar2,&argument_incorrect_type::typeinfo,
                  argument_incorrect_type::~argument_incorrect_type);
    }
  }
  else {
    uVar1 = std::numeric_limits<int>::max();
    if (uVar1 < u) {
      paVar2 = (argument_incorrect_type *)__cxa_allocate_exception(0x28);
      argument_incorrect_type::argument_incorrect_type(paVar2,text);
      __cxa_throw(paVar2,&argument_incorrect_type::typeinfo,
                  argument_incorrect_type::~argument_incorrect_type);
    }
  }
  return;
}

Assistant:

void
        operator()(bool negative, U u, const std::string& text)
        {
          if (negative)
          {
            if (u > static_cast<U>((std::numeric_limits<T>::min)()))
            {
              throw argument_incorrect_type(text);
            }
          }
          else
          {
            if (u > static_cast<U>((std::numeric_limits<T>::max)()))
            {
              throw argument_incorrect_type(text);
            }
          }
        }